

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator.cpp
# Opt level: O0

int main(void)

{
  Person *pPVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  PersonReference j;
  string local_a0 [32];
  undefined1 local_80 [8];
  PersonReference m;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  PersonReference p;
  ChatRoom room;
  
  ChatRoom::ChatRoom((ChatRoom *)
                     &p.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"Peter",&local_59);
  ChatRoom::join((ChatRoom *)local_38,
                 (string *)
                 &p.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Mark",
             (allocator<char> *)
             ((long)&j.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ChatRoom::join((ChatRoom *)local_80,
                 (string *)
                 &p.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&j.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"John",&local_d9);
  ChatRoom::join((ChatRoom *)local_b8,
                 (string *)
                 &p.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"Hi everyone!",&local_101);
  Person::send(pPVar1,(int)local_100,__buf,in_RCX,in_R8D);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"Hi everyone!",&local_129);
  Person::send(pPVar1,(int)local_128,__buf_00,in_RCX,in_R8D);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"Hi everyone!",&local_151);
  Person::send(pPVar1,(int)local_150,__buf_01,in_RCX,in_R8D);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  pPVar1 = ChatRoom::PersonReference::operator->((PersonReference *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"Peter",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Yo Pete!",&local_1a1);
  Person::private_message(pPVar1,&local_178,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  ChatRoom::PersonReference::~PersonReference((PersonReference *)local_b8);
  ChatRoom::PersonReference::~PersonReference((PersonReference *)local_80);
  ChatRoom::PersonReference::~PersonReference((PersonReference *)local_38);
  ChatRoom::~ChatRoom((ChatRoom *)
                      &p.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
	ChatRoom room;
	auto p{room.join("Peter")};
	auto m{room.join("Mark")};
	auto j{room.join("John")};
	p->send("Hi everyone!");
	m->send("Hi everyone!");
	j->send("Hi everyone!");
	j->private_message("Peter", "Yo Pete!");

	return 0;
}